

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var Js::TypedArrayBase::EntryForEach(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  int n;
  CallFlags e;
  uint32 uVar4;
  ScriptContext *pSVar5;
  ThreadContext *pTVar6;
  Var *values;
  undefined4 *puVar7;
  TypedArrayBase *this;
  Var pvVar8;
  RecyclableObject *pRVar9;
  undefined4 extraout_var;
  JavascriptMethod p_Var10;
  JavascriptLibrary *pJVar11;
  CallInfo local_e0;
  CallInfo local_d8;
  undefined1 local_d0 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  Var element;
  RecyclableObject *pRStack_b0;
  uint32 k;
  Var thisArg;
  RecyclableObject *callBackFn;
  uint32 length;
  TypedArrayBase *typedArrayBase;
  undefined1 local_78 [8];
  AutoTagNativeLibraryEntry __tag;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar6,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x743,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  __tag.entry.next = (Entry *)RecyclableObject::GetScriptContext(function);
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_78,function,(CallInfo)function_local,
             L"[TypedArray].prototype.forEach",&stack0x00000000);
  e = Js::operator&((uint)function_local._3_1_,CallFlags_New);
  bVar3 = operator!(e);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x747,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  this = ValidateTypedArray((Arguments *)&scriptContext,(ScriptContext *)__tag.entry.next,
                            L"[TypedArray].prototype.forEach");
  uVar4 = ArrayObject::GetLength((ArrayObject *)this);
  if (1 < ((uint)scriptContext & 0xffffff)) {
    pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,1);
    bVar3 = JavascriptConversion::IsCallable(pvVar8);
    if (bVar3) {
      pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,1);
      pRVar9 = VarTo<Js::RecyclableObject>(pvVar8);
      if (((uint)scriptContext & 0xffffff) < 3) {
        pJVar11 = ScriptContext::GetLibrary((ScriptContext *)__tag.entry.next);
        pRStack_b0 = JavascriptLibraryBase::GetUndefined(&pJVar11->super_JavascriptLibraryBase);
      }
      else {
        pRStack_b0 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,2);
      }
      for (element._4_4_ = 0; element._4_4_ < uVar4; element._4_4_ = element._4_4_ + 1) {
        autoReentrancyHandler._8_4_ =
             (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
               super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject[0x72])(this,(ulong)element._4_4_);
        autoReentrancyHandler._12_4_ = extraout_var;
        pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
        AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_d0,pTVar6);
        pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar6);
        pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
        ThreadContext::AssertJsReentrancy(pTVar6);
        p_Var10 = RecyclableObject::GetEntryPoint(pRVar9);
        CheckIsExecutable(pRVar9,p_Var10);
        p_Var10 = RecyclableObject::GetEntryPoint(pRVar9);
        CallInfo::CallInfo(&local_d8,CallFlags_Value,4);
        CallInfo::CallInfo(&local_e0,CallFlags_Value,4);
        uVar2 = autoReentrancyHandler._8_8_;
        pvVar8 = JavascriptNumber::ToVar(element._4_4_,(ScriptContext *)__tag.entry.next);
        (*p_Var10)(pRVar9,(CallInfo)pRVar9,local_d8,0,0,0,0,local_e0,pRStack_b0,uVar2,pvVar8,this);
        AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_d0);
      }
      pJVar11 = ScriptContext::GetLibrary((ScriptContext *)__tag.entry.next);
      pRVar9 = JavascriptLibraryBase::GetUndefined(&pJVar11->super_JavascriptLibraryBase);
      AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_78);
      return pRVar9;
    }
  }
  JavascriptError::ThrowTypeError
            ((ScriptContext *)__tag.entry.next,-0x7ff5ec34,L"[TypedArray].prototype.forEach");
}

Assistant:

Var TypedArrayBase::EntryForEach(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("[TypedArray].prototype.forEach"));

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(TypedArray_Prototype_forEach);

        TypedArrayBase* typedArrayBase = ValidateTypedArray(args, scriptContext, _u("[TypedArray].prototype.forEach"));
        uint32 length = typedArrayBase->GetLength();

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.forEach"));
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        for (uint32 k = 0; k < length; k++)
        {
            // No need for HasItem, as we have already established that this API can be called only on the TypedArray object. So Proxy scenario cannot happen.

            Var element = typedArrayBase->DirectGetItem(k);

            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                CALL_FUNCTION(scriptContext->GetThreadContext(),
                    callBackFn, CallInfo(CallFlags_Value, 4),
                    thisArg,
                    element,
                    JavascriptNumber::ToVar(k, scriptContext),
                    typedArrayBase);
            }
            END_SAFE_REENTRANT_CALL
        }

        return scriptContext->GetLibrary()->GetUndefined();
    }